

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
readAtFile(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,path *path,
          vector<char,_std::allocator<char>_> *argPool)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  bool local_1ed;
  value_type local_163;
  value_type local_162;
  value_type local_161;
  size_type local_160;
  undefined4 local_154;
  int local_150;
  undefined1 local_149;
  int c;
  undefined1 local_118 [8];
  File file;
  vector<char,_std::allocator<char>_> *argPool_local;
  path *path_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *argvOfs;
  
  file._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._240_8_ =
       argPool;
  File::File((File *)local_118);
  iVar1 = File::open((File *)local_118,(char *)path,8);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    File::string((string *)&c,(File *)local_118,path);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fatal("Error reading @%s: %s",pcVar2,pcVar4);
  }
  local_149 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  while( true ) {
    File::operator->((File *)local_118);
    local_150 = std::streambuf::sbumpc();
    if (local_150 == -1) break;
    iVar1 = isblank(local_150);
    if ((iVar1 == 0) && (local_150 != 10)) {
      if (local_150 == 0xd) {
        File::operator->((File *)local_118);
        std::streambuf::sbumpc();
      }
      else if (local_150 == 0x23) {
        while( true ) {
          File::operator->((File *)local_118);
          local_150 = std::streambuf::sbumpc();
          if (local_150 == 10) break;
          if (local_150 == -1) goto LAB_00107972;
        }
        local_150 = 10;
      }
      else {
        do {
          local_160 = std::vector<char,_std::allocator<char>_>::size
                                ((vector<char,_std::allocator<char>_> *)
                                 file._file.
                                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                 .
                                 super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 ._240_8_);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (__return_storage_ptr__,&local_160);
          local_161 = (value_type)local_150;
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)
                     file._file.
                     super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                     .
                     super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     ._240_8_,&local_161);
          while( true ) {
            File::operator->((File *)local_118);
            local_150 = std::streambuf::sbumpc();
            if (((local_150 == -1) || (local_150 == 10)) || (iVar1 = isblank(local_150), iVar1 != 0)
               ) goto LAB_0010789c;
            if (local_150 == 0xd) break;
            local_162 = (value_type)local_150;
            std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)
                       file._file.
                       super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       ._240_8_,&local_162);
          }
          File::operator->((File *)local_118);
          std::streambuf::sbumpc();
LAB_0010789c:
          local_163 = '\0';
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)
                     file._file.
                     super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                     .
                     super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     ._240_8_,&local_163);
          while (iVar1 = isblank(local_150), iVar1 != 0) {
            File::operator->((File *)local_118);
            local_150 = std::streambuf::sbumpc();
          }
          if (local_150 == 0xd) {
            File::operator->((File *)local_118);
            local_150 = std::streambuf::sbumpc();
          }
          local_1ed = local_150 != 10 && local_150 != -1;
        } while (local_1ed);
      }
    }
  }
LAB_00107972:
  local_149 = 1;
  local_150 = 0xffffffff;
  local_154 = 1;
  File::~File((File *)local_118);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> readAtFile(std::filesystem::path const &path,
                                      std::vector<char> &argPool) {
	File file;
	if (!file.open(path, std::ios_base::in)) {
		fatal("Error reading @%s: %s", file.string(path).c_str(), strerror(errno));
	}

	// We only filter out `EOF`, but calling `isblank()` on anything else is UB!
	static_assert(std::remove_reference_t<decltype(*file)>::traits_type::eof() == EOF,
	              "isblank(char_traits<...>::eof()) is UB!");
	std::vector<size_t> argvOfs;

	for (;;) {
		int c;

		// First, discard any leading whitespace
		do {
			c = file->sbumpc();
			if (c == EOF) {
				return argvOfs;
			}
		} while (isblank(c));

		switch (c) {
		case '#': // If it's a comment, discard everything until EOL
			while ((c = file->sbumpc()) != '\n') {
				if (c == EOF) {
					return argvOfs;
				}
			}
			continue; // Start processing the next line
		// If it's an empty line, ignore it
		case '\r': // Assuming CRLF here
			file->sbumpc(); // Discard the upcoming '\n'
			[[fallthrough]];
		case '\n':
			continue; // Start processing the next line
		}

		// Alright, now we can parse the line
		do {
			// Read one argument (until the next whitespace char).
			// We know there is one because we already have its first character in `c`.
			argvOfs.push_back(argPool.size());
			// Reading and appending characters one at a time may be inefficient, but I'm counting
			// on `vector` and `sbumpc` to do the right thing here.
			argPool.push_back(c); // Push the character we've already read
			for (;;) {
				c = file->sbumpc();
				if (c == EOF || c == '\n' || isblank(c)) {
					break;
				} else if (c == '\r') {
					file->sbumpc(); // Discard the '\n'
					break;
				}
				argPool.push_back(c);
			}
			argPool.push_back('\0');

			// Discard whitespace until the next argument (candidate)
			while (isblank(c)) {
				c = file->sbumpc();
			}
			if (c == '\r') {
				c = file->sbumpc(); // Skip the '\n'
			}
		} while (c != '\n' && c != EOF); // End if we reached EOL
	}
}